

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExporter.cpp
# Opt level: O1

int __thiscall iDynTree::ModelExporter::init(ModelExporter *this,EVP_PKEY_CTX *ctx)

{
  SensorsList *this_00;
  undefined4 uVar1;
  long *in_RCX;
  SensorsList *in_RDX;
  Model modelCopy;
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined1 local_198;
  long *local_190 [2];
  long local_180 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  Model local_158 [304];
  
  iDynTree::Model::Model(local_158,(Model *)ctx);
  this_00 = (SensorsList *)iDynTree::Model::sensors();
  iDynTree::SensorsList::operator=(this_00,in_RDX);
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char*>((string *)local_1b8,*in_RCX,in_RCX[1] + *in_RCX);
  local_198 = (undefined1)in_RCX[4];
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char*>((string *)local_190,in_RCX[5],in_RCX[6] + in_RCX[5]);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(in_RCX + 9));
  init(this,(EVP_PKEY_CTX *)local_158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_170);
  if (local_190[0] != local_180) {
    operator_delete(local_190[0],local_180[0] + 1);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  uVar1 = iDynTree::Model::~Model(local_158);
  return CONCAT31((int3)((uint)uVar1 >> 8),1);
}

Assistant:

bool ModelExporter::init(const Model& model,
                         const SensorsList& sensors,
                         const ModelExporterOptions options)
{
    Model modelCopy = model;
    modelCopy.sensors() = sensors;
    return init(modelCopy, options);
}